

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_fcc_cond(DisasCompare_conflict *c,DisasContext_conflict2 *s,int cond)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGv_i32 res;
  TCGv_i32 pTVar2;
  int32_t iVar3;
  uintptr_t o;
  TCGCond TStack_30;
  
  tcg_ctx = s->uc->tcg_ctx;
  c->g1 = true;
  pTVar1 = tcg_const_i32_m68k(tcg_ctx,0);
  c->v2 = pTVar1;
  c->g2 = false;
  res = tcg_temp_new_i32(tcg_ctx);
  gen_load_fcr(s,res,2);
  pTVar1 = res;
  switch(cond) {
  case 0:
  case 0x10:
    c->v1 = c->v2;
    TStack_30 = TCG_COND_NEVER;
    goto LAB_00681f32;
  case 1:
  case 0x11:
    pTVar2 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar2;
    c->g1 = false;
    iVar3 = 0x4000000;
    break;
  case 2:
  case 0x12:
    pTVar2 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar2;
    c->g1 = false;
    goto LAB_00681d45;
  case 3:
  case 0x13:
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar1;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx,pTVar1,res,0x1000000);
    tcg_gen_shli_i32_m68k(tcg_ctx,c->v1,c->v1,3);
    iVar3 = 0xc000000;
    goto LAB_00681ede;
  case 4:
  case 0x14:
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar1;
    c->g1 = false;
    tcg_gen_xori_i32_m68k(tcg_ctx,pTVar1,res,0x8000000);
    pTVar2 = c->v1;
    pTVar1 = pTVar2;
LAB_00681d45:
    iVar3 = 0xd000000;
    goto LAB_00681e8e;
  case 5:
  case 0x15:
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar1;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx,pTVar1,res,0x1000000);
    tcg_gen_shli_i32_m68k(tcg_ctx,c->v1,c->v1,3);
    tcg_gen_andc_i32_m68k(tcg_ctx,c->v1,res,c->v1);
    pTVar2 = c->v1;
    iVar3 = 0xc000000;
    pTVar1 = pTVar2;
    break;
  case 6:
  case 0x16:
    pTVar2 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar2;
    c->g1 = false;
    iVar3 = 0x5000000;
    goto LAB_00681e8e;
  case 7:
  case 0x17:
    pTVar2 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar2;
    c->g1 = false;
    iVar3 = 0x1000000;
    goto LAB_00681e8e;
  case 8:
  case 0x18:
    pTVar2 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar2;
    c->g1 = false;
    iVar3 = 0x1000000;
    break;
  case 9:
  case 0x19:
    pTVar2 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar2;
    c->g1 = false;
    iVar3 = 0x5000000;
    break;
  case 10:
  case 0x1a:
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar1;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx,pTVar1,res,0x4000000);
    tcg_gen_shli_i32_m68k(tcg_ctx,c->v1,c->v1,1);
    iVar3 = 0x9000000;
LAB_00681ede:
    tcg_gen_andi_i32_m68k(tcg_ctx,res,res,iVar3);
    tcg_gen_or_i32(tcg_ctx,c->v1,c->v1,res);
LAB_00681ef5:
    tcg_gen_xori_i32_m68k(tcg_ctx,c->v1,c->v1,0x8000000);
    goto LAB_00681f2f;
  case 0xb:
  case 0x1b:
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar1;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx,pTVar1,res,0xd000000);
    goto LAB_00681ef5;
  case 0xc:
  case 0x1c:
    pTVar1 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar1;
    c->g1 = false;
    tcg_gen_andi_i32_m68k(tcg_ctx,pTVar1,res,0x4000000);
    tcg_gen_shli_i32_m68k(tcg_ctx,c->v1,c->v1,1);
    tcg_gen_andc_i32_m68k(tcg_ctx,c->v1,res,c->v1);
    pTVar2 = c->v1;
    iVar3 = 0x9000000;
    pTVar1 = pTVar2;
    break;
  case 0xd:
  case 0x1d:
    pTVar2 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar2;
    c->g1 = false;
    iVar3 = 0xd000000;
    break;
  case 0xe:
  case 0x1e:
    pTVar2 = tcg_temp_new_i32(tcg_ctx);
    c->v1 = pTVar2;
    c->g1 = false;
    iVar3 = 0x4000000;
LAB_00681e8e:
    tcg_gen_andi_i32_m68k(tcg_ctx,pTVar2,pTVar1,iVar3);
    TStack_30 = TCG_COND_EQ;
    goto LAB_00681f32;
  case 0xf:
  case 0x1f:
    c->v1 = c->v2;
    TStack_30 = TCG_COND_ALWAYS;
    goto LAB_00681f32;
  default:
    goto switchD_00681c1a_default;
  }
  tcg_gen_andi_i32_m68k(tcg_ctx,pTVar2,pTVar1,iVar3);
LAB_00681f2f:
  TStack_30 = TCG_COND_NE;
LAB_00681f32:
  c->tcond = TStack_30;
switchD_00681c1a_default:
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(res + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_fcc_cond(DisasCompare *c, DisasContext *s, int cond)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv fpsr;

    c->g1 = 1;
    c->v2 = tcg_const_i32(tcg_ctx, 0);
    c->g2 = 0;
    /* TODO: Raise BSUN exception.  */
    fpsr = tcg_temp_new(tcg_ctx);
    gen_load_fcr(s, fpsr, M68K_FPSR);
    switch (cond) {
    case 0:  /* False */
    case 16: /* Signaling False */
        c->v1 = c->v2;
        c->tcond = TCG_COND_NEVER;
        break;
    case 1:  /* EQual Z */
    case 17: /* Signaling EQual Z */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_Z);
        c->tcond = TCG_COND_NE;
        break;
    case 2:  /* Ordered Greater Than !(A || Z || N) */
    case 18: /* Greater Than !(A || Z || N) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr,
                         FPSR_CC_A | FPSR_CC_Z | FPSR_CC_N);
        c->tcond = TCG_COND_EQ;
        break;
    case 3:  /* Ordered Greater than or Equal Z || !(A || N) */
    case 19: /* Greater than or Equal Z || !(A || N) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A);
        tcg_gen_shli_i32(tcg_ctx, c->v1, c->v1, ctz32(FPSR_CC_N) - ctz32(FPSR_CC_A));
        tcg_gen_andi_i32(tcg_ctx, fpsr, fpsr, FPSR_CC_Z | FPSR_CC_N);
        tcg_gen_or_i32(tcg_ctx, c->v1, c->v1, fpsr);
        tcg_gen_xori_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 4:  /* Ordered Less Than !(!N || A || Z); */
    case 20: /* Less Than !(!N || A || Z); */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_xori_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_N);
        tcg_gen_andi_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_N | FPSR_CC_A | FPSR_CC_Z);
        c->tcond = TCG_COND_EQ;
        break;
    case 5:  /* Ordered Less than or Equal Z || (N && !A) */
    case 21: /* Less than or Equal Z || (N && !A) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A);
        tcg_gen_shli_i32(tcg_ctx, c->v1, c->v1, ctz32(FPSR_CC_N) - ctz32(FPSR_CC_A));
        tcg_gen_andc_i32(tcg_ctx, c->v1, fpsr, c->v1);
        tcg_gen_andi_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_Z | FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 6:  /* Ordered Greater or Less than !(A || Z) */
    case 22: /* Greater or Less than !(A || Z) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A | FPSR_CC_Z);
        c->tcond = TCG_COND_EQ;
        break;
    case 7:  /* Ordered !A */
    case 23: /* Greater, Less or Equal !A */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A);
        c->tcond = TCG_COND_EQ;
        break;
    case 8:  /* Unordered A */
    case 24: /* Not Greater, Less or Equal A */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A);
        c->tcond = TCG_COND_NE;
        break;
    case 9:  /* Unordered or Equal A || Z */
    case 25: /* Not Greater or Less then A || Z */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A | FPSR_CC_Z);
        c->tcond = TCG_COND_NE;
        break;
    case 10: /* Unordered or Greater Than A || !(N || Z)) */
    case 26: /* Not Less or Equal A || !(N || Z)) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_Z);
        tcg_gen_shli_i32(tcg_ctx, c->v1, c->v1, ctz32(FPSR_CC_N) - ctz32(FPSR_CC_Z));
        tcg_gen_andi_i32(tcg_ctx, fpsr, fpsr, FPSR_CC_A | FPSR_CC_N);
        tcg_gen_or_i32(tcg_ctx, c->v1, c->v1, fpsr);
        tcg_gen_xori_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 11: /* Unordered or Greater or Equal A || Z || !N */
    case 27: /* Not Less Than A || Z || !N */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A | FPSR_CC_Z | FPSR_CC_N);
        tcg_gen_xori_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 12: /* Unordered or Less Than A || (N && !Z) */
    case 28: /* Not Greater than or Equal A || (N && !Z) */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_Z);
        tcg_gen_shli_i32(tcg_ctx, c->v1, c->v1, ctz32(FPSR_CC_N) - ctz32(FPSR_CC_Z));
        tcg_gen_andc_i32(tcg_ctx, c->v1, fpsr, c->v1);
        tcg_gen_andi_i32(tcg_ctx, c->v1, c->v1, FPSR_CC_A | FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 13: /* Unordered or Less or Equal A || Z || N */
    case 29: /* Not Greater Than A || Z || N */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_A | FPSR_CC_Z | FPSR_CC_N);
        c->tcond = TCG_COND_NE;
        break;
    case 14: /* Not Equal !Z */
    case 30: /* Signaling Not Equal !Z */
        c->v1 = tcg_temp_new(tcg_ctx);
        c->g1 = 0;
        tcg_gen_andi_i32(tcg_ctx, c->v1, fpsr, FPSR_CC_Z);
        c->tcond = TCG_COND_EQ;
        break;
    case 15: /* True */
    case 31: /* Signaling True */
        c->v1 = c->v2;
        c->tcond = TCG_COND_ALWAYS;
        break;
    }
    tcg_temp_free(tcg_ctx, fpsr);
}